

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalCreateFileMapping
                    (CPalThread *pThread,HANDLE hFile,LPSECURITY_ATTRIBUTES lpFileMappingAttributes,
                    DWORD flProtect,DWORD dwMaximumSizeHigh,DWORD dwMaximumSizeLow,LPCWSTR lpName,
                    HANDLE *phMapping)

{
  FILE *__stream;
  PAL_ERROR PVar1;
  int iVar2;
  errno_t eVar3;
  PAL_ERROR PVar4;
  int iVar5;
  IFileLockController *pIVar6;
  char *pcVar7;
  ulong uVar8;
  __off64_t _Var9;
  ssize_t sVar10;
  int *piVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  CFileMappingImmutableData *pCVar14;
  CFileProcessLocalData *pCVar15;
  uint uVar16;
  long in_FS_OFFSET;
  undefined1 local_250 [8];
  stat FileInfo;
  stat UnixFileInformation;
  CObjectAttributes objectAttributes;
  long *local_110;
  IPalObject *pRegisteredMapping;
  CFileMappingProcessLocalData *pLocalData;
  CFileProcessLocalData *local_f8;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  CFileProcessLocalData *pFileLocalData;
  IDataLock *pFileLocalDataLock;
  IPalObject *pMapping;
  CFileMappingImmutableData *pImmutableData;
  int local_bc;
  undefined1 local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pImmutableData = (CFileMappingImmutableData *)pThread;
  CObjectAttributes::CObjectAttributes
            ((CObjectAttributes *)(UnixFileInformation.__glibc_reserved + 2),lpName,
             lpFileMappingAttributes);
  pFileLocalDataLock = (IDataLock *)0x0;
  local_110 = (long *)0x0;
  pRegisteredMapping = (IPalObject *)0x0;
  local_f8 = (CFileProcessLocalData *)0x0;
  pMapping = (IPalObject *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pFileObject = (IPalObject *)0x0;
  pFileLocalData = (CFileProcessLocalData *)0x0;
  if (lpName != (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x1a8);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    PVar1 = 0x32;
    goto LAB_0012cd06;
  }
  if (dwMaximumSizeHigh == 0) {
    if ((8 < flProtect) || ((0x114U >> (flProtect & 0x1f) & 1) == 0)) {
      fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x1ba);
      fprintf(_stderr,
              "invalid flProtect %#x, acceptable values are PAGE_READONLY (%#x), PAGE_READWRITE (%#x) and PAGE_WRITECOPY (%#x).\n"
              ,(ulong)flProtect,2,4,8);
      goto LAB_0012cd02;
    }
    if (dwMaximumSizeLow == 0 && hFile == (HANDLE)0xffffffffffffffff) {
LAB_0012cdb1:
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_0012cf45:
        abort();
      }
      PVar4 = 0x57;
      pCVar14 = pImmutableData;
      iVar2 = -1;
      goto LAB_0012cd11;
    }
    PVar1 = (**(code **)*g_pObjectManager)
                      (g_pObjectManager,pImmutableData,&otFileMapping,
                       UnixFileInformation.__glibc_reserved + 2,&pFileLocalDataLock);
    if ((PVar1 == 0) &&
       (PVar1 = (*pFileLocalDataLock->_vptr_IDataLock[2])(pFileLocalDataLock,&pMapping),
       pCVar14 = pImmutableData, PVar1 == 0)) {
      if (hFile == (HANDLE)0xffffffffffffffff) {
        eVar3 = strcpy_s((char *)pMapping,0x1000,"/dev/zero");
        if ((eVar3 == 0) && (iVar2 = InternalOpen((char *)pMapping,2), iVar2 != -1))
        goto LAB_0012cf63;
        iVar2 = -1;
        PVar4 = 0x54f;
        goto LAB_0012cf38;
      }
      iVar2 = (**(code **)(*g_pObjectManager + 0x28))
                        (g_pObjectManager,pImmutableData,hFile,aotFile,0x80000000,&pLocalDataLock);
      if (iVar2 != 0) goto LAB_0012cdb1;
      PVar1 = (*pLocalDataLock->_vptr_IDataLock[3])
                        (pLocalDataLock,pCVar14,0,&pFileLocalData,&pFileObject);
      pCVar14 = pImmutableData;
      if (PVar1 == 0) {
        if ((flProtect == 2) || (flProtect == 8)) {
          if ((*(int *)((long)&pFileObject[2]._vptr_IPalObject + 4) == 1) ||
             (uVar16 = *(uint *)&pFileObject[2]._vptr_IPalObject, (uVar16 & 1) != 0)) {
LAB_0012d04d:
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
            PVar4 = 5;
            iVar2 = -1;
            if (pFileLocalData != (CFileProcessLocalData *)0x0) {
              (*(code *)pFileLocalData->pLockController->_vptr_IFileLockController)
                        (pFileLocalData,pImmutableData,0);
            }
            goto LAB_0012cd11;
          }
          if (flProtect == 4) goto LAB_0012cefa;
        }
        else if (flProtect == 4) {
          uVar16 = *(uint *)&pFileObject[2]._vptr_IPalObject;
LAB_0012cefa:
          if ((uVar16 & 2) == 0) goto LAB_0012d04d;
        }
        iVar2 = dup(*(int *)&pFileObject[1]._vptr_IPalObject);
        pCVar14 = pImmutableData;
        if (iVar2 != -1) {
          local_bc = iVar2;
          eVar3 = strcpy_s((char *)pMapping,0x1000,(char *)(pFileObject + 3));
          if (eVar3 == 0) {
            if (pFileLocalData != (CFileProcessLocalData *)0x0) {
              (*(code *)pFileLocalData->pLockController->_vptr_IFileLockController)
                        (pFileLocalData,pImmutableData,0);
            }
            iVar5 = fstat64(local_bc,(stat64 *)(FileInfo.__glibc_reserved + 2));
            iVar2 = local_bc;
            if (iVar5 == -1) {
              fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                      ,0x265);
              __stream = _stderr;
              piVar11 = __errno_location();
              pcVar7 = strerror(*piVar11);
              fprintf(__stream,"fstat() failed for this reason %s.\n",pcVar7);
              PVar4 = 0x54f;
              pCVar14 = pImmutableData;
              iVar2 = local_bc;
              goto LAB_0012cd11;
            }
            if (CONCAT44(UnixFileInformation.st_rdev._4_4_,(DWORD)UnixFileInformation.st_rdev) == 0
                && dwMaximumSizeLow == 0) {
              PVar4 = 0x3ee;
              goto LAB_0012cf38;
            }
            if ((DWORD)UnixFileInformation.st_rdev < dwMaximumSizeLow) {
              if ((flProtect == 8) || (flProtect == 2)) {
                if (PAL_InitializeChakraCoreCalled != false) {
                  PVar4 = 8;
                  pCVar14 = pImmutableData;
                  goto LAB_0012cd11;
                }
                goto LAB_0012cf45;
              }
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
              iVar5 = ftruncate64(local_bc,(ulong)dwMaximumSizeLow);
              fstat64(iVar2,(stat64 *)local_250);
              iVar2 = local_bc;
              if ((iVar5 != 0) || (FileInfo.st_rdev != (long)(int)dwMaximumSizeLow)) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
                uVar8 = lseek64(local_bc,0,1);
                _Var9 = lseek64(iVar2,0,2);
                uVar16 = (uint)_Var9;
                if (uVar16 == 0xffffffff) {
                  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
                  piVar11 = __errno_location();
                  strerror(*piVar11);
                  PVar4 = 0x54f;
                  iVar2 = local_bc;
                }
                else {
                  pLocalData = (CFileMappingProcessLocalData *)(ulong)(dwMaximumSizeLow - uVar16);
                  iVar2 = local_bc;
                  PVar4 = 1;
                  if (uVar16 <= dwMaximumSizeLow && dwMaximumSizeLow - uVar16 != 0) {
                    memset(local_b8,0,0x80);
                    iVar2 = (int)pLocalData;
                    for (uVar16 = 0; uVar16 < iVar2 - 0x80U; uVar16 = uVar16 + 0x80) {
                      sVar10 = write(local_bc,local_b8,0x80);
                      if (sVar10 == -1) goto LAB_0012d41c;
                    }
                    if ((dwMaximumSizeLow == uVar16) ||
                       (sVar10 = write(local_bc,local_b8,(ulong)((int)pLocalData - uVar16)),
                       sVar10 != -1)) {
                      iVar2 = local_bc;
                      lseek64(local_bc,uVar8 & 0xffffffff,0);
                      goto LAB_0012cf63;
                    }
LAB_0012d41c:
                    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
                    piVar11 = __errno_location();
                    strerror(*piVar11);
                    PVar4 = 0x54f;
                    if (*piVar11 == 0x7a) {
                      PVar4 = 0x70;
                    }
                    iVar2 = local_bc;
                    if (*piVar11 == 0x1c) {
                      PVar4 = 0x70;
                    }
                  }
                }
LAB_0012cf38:
                pCVar14 = pImmutableData;
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
                goto LAB_0012cd11;
              }
            }
LAB_0012cf63:
            pCVar14 = pImmutableData;
            if (dwMaximumSizeLow == 0) {
              dwMaximumSizeLow = (DWORD)UnixFileInformation.st_rdev;
            }
            *(DWORD *)&pMapping[0x200]._vptr_IPalObject = dwMaximumSizeLow;
            *(DWORD *)((long)&pMapping[0x200]._vptr_IPalObject + 4) = flProtect;
            *(undefined4 *)&pMapping[0x201]._vptr_IPalObject = 0;
            local_bc = iVar2;
            if (flProtect == 2) {
              uVar12 = 4;
            }
            else if (flProtect == 8) {
              uVar12 = 1;
            }
            else if (flProtect == 4) {
              uVar12 = 6;
            }
            else {
              fprintf(_stderr,"] %s %s:%d","MAPConvertProtectToAccess",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                      ,0x686);
              fprintf(_stderr,
                      "Unknown flag for flProtect. This line should not have been executed.\n ");
              uVar12 = 0xffffffff;
            }
            *(undefined4 *)((long)&pMapping[0x201]._vptr_IPalObject + 4) = uVar12;
            PVar4 = (*pFileLocalDataLock->_vptr_IDataLock[3])
                              (pFileLocalDataLock,pCVar14,1,&local_f8,&pRegisteredMapping);
            if (PVar4 == 0) {
              *(int *)&pRegisteredMapping->_vptr_IPalObject = local_bc;
              (*(code *)local_f8->pLockController->_vptr_IFileLockController)(local_f8,pCVar14,1);
              local_f8 = (CFileProcessLocalData *)0x0;
              PVar4 = (**(code **)(*g_pObjectManager + 8))
                                (g_pObjectManager,pCVar14,pFileLocalDataLock,&aotFileMapping,
                                 flProtect,phMapping,&local_110);
              pFileLocalDataLock = (IDataLock *)0x0;
            }
            iVar2 = local_bc;
            if (local_f8 == (CFileProcessLocalData *)0x0) goto LAB_0012cd11;
            pIVar6 = local_f8->pLockController;
            uVar13 = 1;
            pCVar15 = local_f8;
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
            PVar4 = 0x54f;
            pCVar14 = pImmutableData;
            iVar2 = local_bc;
            if (pFileLocalData == (CFileProcessLocalData *)0x0) goto LAB_0012cd11;
            pIVar6 = pFileLocalData->pLockController;
            uVar13 = 0;
            pCVar15 = pFileLocalData;
          }
          (*(code *)pIVar6->_vptr_IFileLockController)(pCVar15,pCVar14,uVar13);
          iVar2 = local_bc;
          goto LAB_0012cd11;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cf45;
        PVar4 = 0x54f;
        PVar1 = 0x54f;
        if (pFileLocalData != (CFileProcessLocalData *)0x0) {
          (*(code *)pFileLocalData->pLockController->_vptr_IFileLockController)
                    (pFileLocalData,pImmutableData,0);
          iVar2 = -1;
          goto LAB_0012cd11;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x1af);
    fprintf(_stderr,"dwMaximumSizeHigh is always 0.\n");
LAB_0012cd02:
    PVar1 = 0x57;
  }
LAB_0012cd06:
  PVar4 = PVar1;
  pCVar14 = pImmutableData;
  iVar2 = -1;
LAB_0012cd11:
  if ((pFileLocalDataLock != (IDataLock *)0x0) &&
     ((*pFileLocalDataLock->_vptr_IDataLock[8])(pFileLocalDataLock,pCVar14), iVar2 != -1)) {
    close(iVar2);
  }
  if (local_110 != (long *)0x0) {
    (**(code **)(*local_110 + 0x40))(local_110,pCVar14);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pCVar14);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return PVar4;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateFileMapping(
    CPalThread *pThread,
    HANDLE hFile,
    LPSECURITY_ATTRIBUTES lpFileMappingAttributes,
    DWORD flProtect,
    DWORD dwMaximumSizeHigh,
    DWORD dwMaximumSizeLow,
    LPCWSTR lpName,
    HANDLE *phMapping
    )
{
    CObjectAttributes objectAttributes(lpName, lpFileMappingAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pMapping = NULL;
    IPalObject *pRegisteredMapping = NULL;
    CFileMappingProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    CFileMappingImmutableData *pImmutableData = NULL;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pFileLocalData = NULL;
    IDataLock *pFileLocalDataLock = NULL;
    
    struct stat UnixFileInformation;
    INT UnixFd = -1;
    BOOL bPALCreatedTempFile = FALSE;
    UINT nFileSize = 0;

    //
    // Validate parameters
    //

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto ExitInternalCreateFileMapping;
    }

    if (0 != dwMaximumSizeHigh)
    {
        ASSERT("dwMaximumSizeHigh is always 0.\n");
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }
    
    if (PAGE_READWRITE != flProtect
        && PAGE_READONLY != flProtect
        && PAGE_WRITECOPY != flProtect)
    {
        ASSERT( "invalid flProtect %#x, acceptable values are PAGE_READONLY "
                "(%#x), PAGE_READWRITE (%#x) and PAGE_WRITECOPY (%#x).\n", 
                flProtect, PAGE_READONLY, PAGE_READWRITE, PAGE_WRITECOPY );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }

    if (hFile == INVALID_HANDLE_VALUE && 0 == dwMaximumSizeLow)
    {
        ERROR( "If hFile is INVALID_HANDLE_VALUE, then you must specify a size.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }

    if (hFile != INVALID_HANDLE_VALUE && NULL != lpName)
    {
        ASSERT( "If hFile is not -1, then lpName must be NULL.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFileMapping,
        &objectAttributes,
        &pMapping
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalCreateFileMapping;
    }

    palError = pMapping->GetImmutableData(reinterpret_cast<void**>(&pImmutableData));
    if (NO_ERROR != palError)
    {
        goto ExitInternalCreateFileMapping;
    }

    if (hFile == INVALID_HANDLE_VALUE)
    {
        //
        // Note: this path is what prevents us supporting the
        // duplication of file mapping objects across processes, since
        // there is no backing file that the other process can open. We can
        // avoid this restriction by always using a temp backing file for
        // anonymous mappings.
        //
        
        /* Anonymous mapped files. */
        if (strcpy_s(pImmutableData->szFileName, sizeof(pImmutableData->szFileName), "/dev/zero") != SAFECRT_SUCCESS)
        {
            ERROR( "strcpy_s failed!\n" );
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }

#if HAVE_MMAP_DEV_ZERO

        UnixFd = InternalOpen(pImmutableData->szFileName, O_RDWR);
        if ( -1 == UnixFd )
        {
            ERROR( "Unable to open the file.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }

#else //!HAVE_MMAP_DEV_ZERO

        UnixFd = -1;  /* will pass MAP_ANON to mmap() instead */

#endif //!HAVE_MMAP_DEV_ZERO

    }
    else
    {
        if ( hFile != INVALID_HANDLE_VALUE )
        {
            palError = g_pObjectManager->ReferenceObjectByHandle(
                pThread,
                hFile,
                &aotFile,
                GENERIC_READ,
                &pFileObject
                );

            if (NO_ERROR != palError)
            {
                ERROR("Unable to obtain file data.\n");
                palError = ERROR_INVALID_PARAMETER;
                goto ExitInternalCreateFileMapping;
            }

            palError = pFileObject->GetProcessLocalData(
                pThread,
                ReadLock, 
                &pFileLocalDataLock,
                reinterpret_cast<void**>(&pFileLocalData)
                );

            if (NO_ERROR != palError)
            {
                goto ExitInternalCreateFileMapping;
            }
        
            /* We need to check to ensure flProtect jives with 
               the permission on the file handle */
            if (!MAPIsRequestPermissible(flProtect, pFileLocalData))
            {
                ERROR("File handle does not have the correct "
                      "permissions to create mapping\n" );
                palError = ERROR_ACCESS_DENIED;
                if (NULL != pFileLocalDataLock)
                {
                    pFileLocalDataLock->ReleaseLock(pThread, FALSE);
                }
                goto ExitInternalCreateFileMapping;
            }

            //
            // TODO: technically, the file mapping object should hold
            // a reference to the passed in file object. This implementation
            // only keeps the underlying native file structure (i.e., what
            // the duplicated descriptors point to) open. There may be a risk
            // here pertaining to the file lock information that the PAL must
            // maintain (e.g,. if the passed in handle is closed immediately
            // after the file mapping is opened then the lock information will
            // be released, since we're not doing anything to keep it alive
            // here).
            //
            // Having a direct reference to the underlying file object adds
            // some complication, especially in cross-process cases. We may
            // want to consider adding a reference to the PAL's file lock
            // information, though...
            //
            
            UnixFd = dup(pFileLocalData->unix_fd);
            if (-1 == UnixFd)
            {
                ERROR( "Unable to duplicate the Unix file descriptor!\n" );
                palError = ERROR_INTERNAL_ERROR;
                if (NULL != pFileLocalDataLock)
                {
                    pFileLocalDataLock->ReleaseLock(pThread, FALSE);
                }
                goto ExitInternalCreateFileMapping;
            }
  
            if (strcpy_s(pImmutableData->szFileName, sizeof(pImmutableData->szFileName), pFileLocalData->unix_filename) != SAFECRT_SUCCESS)
            {
                ERROR( "strcpy_s failed!\n" );
                palError = ERROR_INTERNAL_ERROR;
                if (NULL != pFileLocalDataLock)
                {
                    pFileLocalDataLock->ReleaseLock(pThread, FALSE);
                }
                goto ExitInternalCreateFileMapping;
            }

            if (NULL != pFileLocalDataLock)
            {
                pFileLocalDataLock->ReleaseLock(pThread, FALSE);
            }
        } 
        else 
        {
            ASSERT("should not get here\n");
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }
    
        if (-1 == fstat(UnixFd, &UnixFileInformation))
        {
            ASSERT("fstat() failed for this reason %s.\n", strerror(errno));
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }

        if ( 0 == UnixFileInformation.st_size && 
             0 == dwMaximumSizeHigh && 0 == dwMaximumSizeLow )
        {
            ERROR( "The file cannot be a zero length file.\n" );
            palError = ERROR_FILE_INVALID;
            goto ExitInternalCreateFileMapping;
        }

        if ( INVALID_HANDLE_VALUE != hFile && 
             dwMaximumSizeLow > (DWORD) UnixFileInformation.st_size && 
             ( PAGE_READONLY == flProtect || PAGE_WRITECOPY == flProtect ) )
        {
            /* In this situation, Windows returns an error, because the
               permissions requested do not allow growing the file */
            ERROR( "The file cannot be grown do to the map's permissions.\n" );
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto ExitInternalCreateFileMapping;
        }
      
        if ( (DWORD) UnixFileInformation.st_size < dwMaximumSizeLow )
        {
            TRACE( "Growing the size of file on disk to match requested size.\n" );

            /* Need to grow the file on disk to match size. */
            palError = MAPGrowLocalFile(UnixFd, dwMaximumSizeLow);
            if (NO_ERROR != palError)
            {
                ERROR( "Unable to grow the file on disk.\n" );
                goto ExitInternalCreateFileMapping;
            }
        }
    }

    nFileSize = ( 0 == dwMaximumSizeLow && 0 == dwMaximumSizeHigh ) ? 
        UnixFileInformation.st_size : dwMaximumSizeLow;

    pImmutableData->MaxSize = nFileSize;
    pImmutableData->flProtect = flProtect;
    pImmutableData->bPALCreatedTempFile = bPALCreatedTempFile;
    pImmutableData->dwDesiredAccessWhenOpened = MAPConvertProtectToAccess(flProtect);
    

    //
    // The local data isn't grabbed / modified until here so that we don't
    // need to worry ourselves with locking issues with the passed in
    // file handle -- all operations concerning the file handle are completed
    // before we deal with the lock for the new object.
    //

    palError = pMapping->GetProcessLocalData(
        pThread,
        WriteLock,
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalCreateFileMapping;
    }

    pLocalData->UnixFd = UnixFd;

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    if (-1 == UnixFd)
    {
        pLocalData->MappedFileDevNum = (dev_t)-1; /* there is no standard NO_DEV */
        pLocalData->MappedFileInodeNum = NO_INO;
    }
    else
    {
        struct stat st;

        if (0 == fstat(UnixFd, &st))
        {
            pLocalData->MappedFileDevNum = st.st_dev;
            pLocalData->MappedFileInodeNum = st.st_ino;
        }
        else
        {
            ERROR("Couldn't get inode info for fd=%d to be stored in mapping object\n", UnixFd);
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }
    }
#endif

    pLocalDataLock->ReleaseLock(pThread, TRUE);
    pLocalDataLock = NULL;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pMapping,
        &aotFileMapping, 
        flProtect,          // TODO: is flProtect really an access right?
        phMapping,
        &pRegisteredMapping
        );

    //
    // pMapping is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line. This also ensures that we won't attempt to release
    // any data associated with the mapping object here, as if any cleanup is
    // necessary due to a failure in RegisterObject (which includes another
    // object by the same name already existing) the cleanup will take place
    // when that routine releases the reference to pMapping.
    //
    
    pMapping = NULL;

ExitInternalCreateFileMapping:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(
            pThread,
            TRUE
            );
    }

    if (NULL != pMapping)
    {
        pMapping->ReleaseReference(pThread);

        if (bPALCreatedTempFile)
        {
            unlink(pImmutableData->szFileName);
        }

        if (-1 != UnixFd)
        {
            close(UnixFd);
        }
    }

    if (NULL != pRegisteredMapping)
    {
        pRegisteredMapping->ReleaseReference(pThread);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}